

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cc
# Opt level: O0

void tvm::runtime::SaveBinaryToFile(string *file_name,string *data)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  ostringstream *poVar3;
  ostream *poVar4;
  long lVar5;
  LogMessageFatal local_3b0;
  char local_218 [8];
  ofstream fs;
  string *data_local;
  string *file_name_local;
  
  _Var2 = std::operator|(_S_out,_S_bin);
  std::ofstream::ofstream(local_218,(string *)file_name,_Var2);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) != 0) {
    dmlc::LogMessageFatal::LogMessageFatal
              (&local_3b0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/file_util.cc"
               ,0x8a);
    poVar3 = dmlc::LogMessageFatal::stream_abi_cxx11_(&local_3b0);
    poVar4 = std::operator<<((ostream *)poVar3,"Check failed: !fs.fail()");
    poVar4 = std::operator<<(poVar4,": ");
    poVar4 = std::operator<<(poVar4,"Cannot open ");
    std::operator<<(poVar4,(string *)file_name);
    dmlc::LogMessageFatal::~LogMessageFatal(&local_3b0);
  }
  lVar5 = std::__cxx11::string::operator[]((ulong)data);
  std::__cxx11::string::length();
  std::ostream::write(local_218,lVar5);
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void SaveBinaryToFile(
    const std::string &file_name,
    const std::string &data) {
  std::ofstream fs(file_name, std::ios::out | std::ios::binary);
  CHECK(!fs.fail()) << "Cannot open " << file_name;
  fs.write(&data[0], data.length());
}